

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

ArrayIndex __thiscall
anon_unknown.dwarf_a15f78::CodemodelConfig::GetDirectoryIndex
          (CodemodelConfig *this,cmStateSnapshot s)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
          ::find(&(this->DirectoryMap)._M_t,&s);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header)
  {
    return *(ArrayIndex *)&iVar1._M_node[1]._M_right;
  }
  __assert_fail("i != this->DirectoryMap.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileAPICodemodel.cxx"
                ,0x1be,
                "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
               );
}

Assistant:

Json::ArrayIndex CodemodelConfig::GetDirectoryIndex(cmStateSnapshot s)
{
  auto i = this->DirectoryMap.find(s);
  assert(i != this->DirectoryMap.end());
  return i->second;
}